

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O1

bool lunasvg::matchSimpleSelector(SimpleSelector *selector,SVGElement *element)

{
  pointer pAVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pvVar4;
  SimpleSelector *pSVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  string *psVar9;
  size_type sVar10;
  SVGElement *pSVar11;
  size_type __rlen;
  ulong __n;
  size_t __n_00;
  pointer __s2;
  pointer __s1;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *subSelector;
  pointer pvVar12;
  AttributeSelector *sel;
  pointer pAVar13;
  pointer pPVar14;
  SimpleSelector *pSVar15;
  bool bVar16;
  bool bVar17;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string_view local_50;
  _List_node_base *local_40;
  pointer local_38;
  
  if ((selector->id == Star) || (selector->id == element->m_id)) {
    pAVar1 = (selector->attributeSelectors).
             super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar13 = (selector->attributeSelectors).
                   super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar16 = pAVar13 != pAVar1, bVar16;
        pAVar13 = pAVar13 + 1) {
      psVar9 = SVGElement::getAttribute_abi_cxx11_(element,pAVar13->id);
      switch(pAVar13->matchType) {
      case None:
        bVar6 = psVar9->_M_string_length == 0;
        goto LAB_0011b149;
      case Equals:
        uVar2 = psVar9->_M_string_length;
        uVar3 = (pAVar13->value)._M_string_length;
        __n = uVar3;
        if (uVar2 < uVar3) {
          __n = uVar2;
        }
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar8 = bcmp((psVar9->_M_dataplus)._M_p,(pAVar13->value)._M_dataplus._M_p,__n);
          bVar6 = iVar8 == 0;
        }
        bVar6 = (bool)(uVar2 == uVar3 & bVar6);
        break;
      case Contains:
        local_60._M_str = (psVar9->_M_dataplus)._M_p;
        local_60._M_len = psVar9->_M_string_length;
        sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (&local_60,(pAVar13->value)._M_dataplus._M_p,0,
                            (pAVar13->value)._M_string_length);
        bVar6 = sVar10 == 0xffffffffffffffff;
LAB_0011b149:
        bVar6 = !bVar6;
        break;
      case Includes:
        local_60._M_str = (psVar9->_M_dataplus)._M_p;
        local_60._M_len = psVar9->_M_string_length;
        local_50._M_str = (pAVar13->value)._M_dataplus._M_p;
        local_50._M_len = (pAVar13->value)._M_string_length;
        bVar6 = includes(&local_60,&local_50);
        break;
      case StartsWith:
        __n_00 = (pAVar13->value)._M_string_length;
        if (__n_00 - 1 < psVar9->_M_string_length) {
          __s1 = (pAVar13->value)._M_dataplus._M_p;
          __s2 = (psVar9->_M_dataplus)._M_p;
LAB_0011b1cb:
          iVar8 = bcmp(__s1,__s2,__n_00);
          bVar6 = iVar8 == 0;
          break;
        }
        goto switchD_0011b0fb_default;
      case EndsWith:
        __n_00 = (pAVar13->value)._M_string_length;
        if (__n_00 - 1 < psVar9->_M_string_length) {
          __s1 = (pAVar13->value)._M_dataplus._M_p;
          __s2 = (psVar9->_M_dataplus)._M_p + (psVar9->_M_string_length - __n_00);
          goto LAB_0011b1cb;
        }
        goto switchD_0011b0fb_default;
      case DashEquals:
        local_60._M_str = (psVar9->_M_dataplus)._M_p;
        local_60._M_len = psVar9->_M_string_length;
        local_50._M_str = (pAVar13->value)._M_dataplus._M_p;
        local_50._M_len = (pAVar13->value)._M_string_length;
        bVar6 = dashequals(&local_60,&local_50);
        break;
      default:
        goto switchD_0011b0fb_default;
      }
      if (bVar6 == false) {
switchD_0011b0fb_default:
        if (bVar16) goto LAB_0011b408;
        break;
      }
    }
    pPVar14 = (selector->pseudoClassSelectors).
              super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (selector->pseudoClassSelectors).
               super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar16 = pPVar14 == local_38;
    if (!bVar16) {
      local_40 = (_List_node_base *)&element->m_children;
      do {
        switch(pPVar14->type) {
        case Empty:
          bVar6 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                     *)&local_40->_M_next)->_M_impl)._M_node.super__List_node_base._M_next ==
                  local_40;
          break;
        case Root:
          bVar6 = (element->super_SVGNode).m_parentElement == (SVGElement *)0x0;
          break;
        case Is:
          pvVar4 = (pPVar14->subSelectors).
                   super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar12 = (pPVar14->subSelectors).
                         super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; bVar6 = pvVar12 == pvVar4,
              !bVar6; pvVar12 = pvVar12 + 1) {
            pSVar15 = (pvVar12->
                      super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar5 = (pvVar12->
                     super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            bVar17 = pSVar15 == pSVar5;
            if (!bVar17) {
              bVar7 = matchSimpleSelector(pSVar15,element);
              if (bVar7) {
                do {
                  pSVar15 = pSVar15 + 1;
                  bVar17 = pSVar15 == pSVar5;
                  if (bVar17) goto LAB_0011b350;
                  bVar7 = matchSimpleSelector(pSVar15,element);
                } while (bVar7);
              }
              if (!bVar17) break;
            }
LAB_0011b350:
          }
          break;
        case Not:
          pvVar4 = (pPVar14->subSelectors).
                   super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar12 = (pPVar14->subSelectors).
                         super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; bVar6 = pvVar12 == pvVar4,
              !bVar6; pvVar12 = pvVar12 + 1) {
            pSVar15 = (pvVar12->
                      super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar5 = (pvVar12->
                     super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            bVar17 = pSVar15 == pSVar5;
            if (!bVar17) {
              bVar7 = matchSimpleSelector(pSVar15,element);
              while (!bVar7) {
                pSVar15 = pSVar15 + 1;
                bVar17 = pSVar15 == pSVar5;
                if (bVar17) goto LAB_0011b3b7;
                bVar7 = matchSimpleSelector(pSVar15,element);
              }
              if (!bVar17) break;
            }
LAB_0011b3b7:
          }
          break;
        case FirstChild:
          pSVar11 = SVGElement::previousElement(element);
          goto LAB_0011b3de;
        case OnlyChild:
          pSVar11 = SVGElement::previousElement(element);
          if (pSVar11 != (SVGElement *)0x0) {
            return bVar16;
          }
        case LastChild:
          pSVar11 = SVGElement::nextElement(element);
LAB_0011b3de:
          bVar6 = pSVar11 == (SVGElement *)0x0;
          break;
        case FirstOfType:
          while( true ) {
            pSVar11 = SVGElement::previousElement(element);
            bVar6 = pSVar11 == (SVGElement *)0x0;
            if (bVar6) break;
            if (pSVar11->m_id == element->m_id) {
              return bVar16;
            }
          }
          break;
        case LastOfType:
          while( true ) {
            pSVar11 = SVGElement::nextElement(element);
            bVar6 = pSVar11 == (SVGElement *)0x0;
            if (bVar6) break;
            if (pSVar11->m_id == element->m_id) {
              return bVar16;
            }
          }
          break;
        default:
          goto switchD_0011b28c_default;
        }
        if (!bVar6) {
          return bVar16;
        }
        pPVar14 = pPVar14 + 1;
        bVar16 = pPVar14 == local_38;
      } while (!bVar16);
    }
  }
  else {
LAB_0011b408:
    bVar16 = false;
  }
switchD_0011b28c_default:
  return bVar16;
}

Assistant:

static bool matchSimpleSelector(const SimpleSelector& selector, const SVGElement* element)
{
    if(selector.id != ElementID::Star && selector.id != element->id())
        return false;
    for(const auto& sel : selector.attributeSelectors) {
        if(!matchAttributeSelector(sel, element)) {
            return false;
        }
    }

    for(const auto& sel : selector.pseudoClassSelectors) {
        if(!matchPseudoClassSelector(sel, element)) {
            return false;
        }
    }

    return true;
}